

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

void __thiscall antlr::BitSet::add(BitSet *this,uint el)

{
  ulong uVar1;
  size_type sVar2;
  uint in_ESI;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  bool in_stack_00000067;
  size_type in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  _Bit_type *local_20;
  _Bit_type *__n;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (ulong)in_ESI;
  __n = local_20;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  if (sVar2 <= uVar1) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000070,in_stack_00000068,in_stack_00000067);
  }
  _local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_type)__n);
  std::_Bit_reference::operator=((_Bit_reference *)&local_20,true);
  return;
}

Assistant:

void BitSet::add(unsigned int el)
{
	if( el >= storage.size() )
		storage.resize( el+1, false );

	storage[el] = true;
}